

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O0

void __thiscall QOpenGLExtensions::flushShared(QOpenGLExtensions *this)

{
  QOpenGLExtensionsPrivate *pQVar1;
  GLubyte *__haystack;
  char *pcVar2;
  undefined8 in_RDI;
  GLenum name;
  size_t i;
  char *vendor;
  QOpenGLExtensionsPrivate *d;
  QOpenGLFunctions *in_stack_ffffffffffffffe0;
  ulong uVar3;
  
  name = (GLenum)((ulong)in_RDI >> 0x20);
  pQVar1 = d_func((QOpenGLExtensions *)0x90f04b);
  if ((pQVar1->flushVendorChecked & 1U) == 0) {
    pQVar1->flushVendorChecked = true;
    pQVar1->flushIsSufficientToSyncContexts = false;
    __haystack = QOpenGLFunctions::glGetString(in_stack_ffffffffffffffe0,name);
    if (__haystack != (GLubyte *)0x0) {
      for (uVar3 = 0; uVar3 < 4; uVar3 = uVar3 + 1) {
        pcVar2 = strstr((char *)__haystack,flushShared::flushEnough[uVar3]);
        if (pcVar2 != (char *)0x0) {
          pQVar1->flushIsSufficientToSyncContexts = true;
          break;
        }
      }
    }
  }
  if ((pQVar1->flushIsSufficientToSyncContexts & 1U) == 0) {
    QOpenGLFunctions::glFinish((QOpenGLFunctions *)0x90f10c);
  }
  else {
    QOpenGLFunctions::glFlush((QOpenGLFunctions *)0x90f101);
  }
  return;
}

Assistant:

void QOpenGLExtensions::flushShared()
{
    Q_D(QOpenGLExtensions);

    if (!d->flushVendorChecked) {
        d->flushVendorChecked = true;
        // It is not quite clear if glFlush() is sufficient to synchronize access to
        // resources between sharing contexts in the same thread. On most platforms this
        // is enough (e.g. iOS explicitly documents it), while certain drivers only work
        // properly when doing glFinish().
        d->flushIsSufficientToSyncContexts = false; // default to false, not guaranteed by the spec
        const char *vendor = (const char *) glGetString(GL_VENDOR);
        if (vendor) {
            static const char *const flushEnough[] = { "Apple", "ATI", "Intel", "NVIDIA" };
            for (size_t i = 0; i < sizeof(flushEnough) / sizeof(const char *); ++i) {
                if (strstr(vendor, flushEnough[i])) {
                    d->flushIsSufficientToSyncContexts = true;
                    break;
                }
            }
        }
    }

    if (d->flushIsSufficientToSyncContexts)
        glFlush();
    else
        glFinish();
}